

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O2

void __thiscall
TPZElementMatrixT<std::complex<double>_>::SetMatrixMinSize
          (TPZElementMatrixT<std::complex<double>_> *this,short NumBli,short NumBlj,short BlSizei,
          short BlSizej)

{
  undefined2 in_register_0000000a;
  int64_t newCols;
  undefined6 in_register_00000032;
  long newRows;
  
  newRows = (long)CONCAT22(in_register_0000000a,BlSizei) *
            (long)(int)CONCAT62(in_register_00000032,NumBli);
  if ((this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.fRow < newRows) {
    newCols = (long)BlSizej * (long)NumBlj;
  }
  else {
    newCols = (long)BlSizej * (long)NumBlj;
    if (newCols <=
        (this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
        super_TPZBaseMatrix.fCol) {
      return;
    }
  }
  TPZFMatrix<std::complex<double>_>::Redim
            (&(this->fMat).super_TPZFMatrix<std::complex<double>_>,newRows,newCols);
  return;
}

Assistant:

void TPZElementMatrixT<TVar>::SetMatrixMinSize(short NumBli, short NumBlj, 
										short BlSizei, short BlSizej) {
	
	
	if(fMat.Rows() < NumBli*BlSizei || fMat.Cols() < NumBlj*BlSizej) {
		fMat.Redim(NumBli*BlSizei,NumBlj*BlSizej);
	}
}